

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::TopUpWithDB
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,uint size)

{
  _Rb_tree_header *p_Var1;
  key_type *__x;
  WalletDescriptor *descriptor;
  _Rb_tree_header *p_Var2;
  DescriptorCache *this_00;
  long lVar3;
  int64_t iVar4;
  element_type *peVar5;
  WalletStorage *pWVar6;
  pointer pCVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  size_type sVar12;
  _Base_ptr p_Var13;
  runtime_error *this_01;
  uint uVar14;
  CScript *script;
  pointer __k;
  int iVar15;
  long in_FS_OFFSET;
  allocator<char> local_439;
  DescriptorCache new_items;
  DescriptorCache temp_cache;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  FlatSigningProvider out_keys;
  uint256 id;
  FlatSigningProvider provider;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> new_spks;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock59,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x8a6,false);
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &new_spks._M_t._M_impl.super__Rb_tree_header._M_header;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar4 = this->m_keypool_size;
  iVar15 = (this->m_wallet_descriptor).next_index;
  iVar10 = (this->m_wallet_descriptor).range_end;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar9 = (*((this->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Descriptor[2]
          )();
  uVar14 = (uint)iVar4;
  if (size != 0) {
    uVar14 = size;
  }
  iVar15 = uVar14 + iVar15;
  if (iVar15 <= iVar10) {
    iVar15 = iVar10;
  }
  if ((char)iVar9 == '\0') {
    (this->m_wallet_descriptor).range_start = 0;
    (this->m_wallet_descriptor).range_end = 1;
    iVar15 = 1;
  }
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01158e68;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetKeys((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *)
          &out_keys,this);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::operator=(&provider.keys._M_t,
              (_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
               *)&out_keys);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
               *)&out_keys);
  (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&id,this);
  descriptor = &this->m_wallet_descriptor;
  uVar14 = this->m_max_cached_index;
  p_Var2 = &out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = &out_keys.keys._M_t._M_impl.super__Rb_tree_header;
  this_00 = &(this->m_wallet_descriptor).cache;
  do {
    uVar14 = uVar14 + 1;
    if (iVar15 <= (int)uVar14) {
      (this->m_wallet_descriptor).range_end = iVar15;
      (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&out_keys,this);
      WalletBatch::WriteDescriptor(batch,(uint256 *)&out_keys,descriptor);
      if ((this->m_wallet_descriptor).range_end + -1 != this->m_max_cached_index) {
        __assert_fail("m_wallet_descriptor.range_end - 1 == m_max_cached_index",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x8de,
                      "bool wallet::DescriptorScriptPubKeyMan::TopUpWithDB(WalletBatch &, unsigned int)"
                     );
      }
      pWVar6 = (this->super_ScriptPubKeyMan).m_storage;
      (*pWVar6->_vptr_WalletStorage[0xb])(pWVar6,&new_spks,this);
      boost::signals2::
      signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
      ::operator()(&(this->super_ScriptPubKeyMan).NotifyCanGetAddressesChanged);
LAB_00974eb8:
      FlatSigningProvider::~FlatSigningProvider(&provider);
      std::
      _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
      ::~_Rb_tree(&new_spks._M_t);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock59.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        return iVar15 <= (int)uVar14;
      }
LAB_009750ae:
      __stack_chk_fail();
    }
    out_keys.super_SigningProvider._vptr_SigningProvider =
         (_func_int **)&PTR__FlatSigningProvider_01158e68;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    temp_cache.m_derived_xpubs._M_h._M_buckets = &temp_cache.m_derived_xpubs._M_h._M_single_bucket;
    temp_cache.m_derived_xpubs._M_h._M_bucket_count = 1;
    temp_cache.m_derived_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    temp_cache.m_derived_xpubs._M_h._M_element_count = 0;
    temp_cache.m_derived_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    temp_cache.m_derived_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
    temp_cache.m_derived_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    temp_cache.m_parent_xpubs._M_h._M_buckets = &temp_cache.m_parent_xpubs._M_h._M_single_bucket;
    temp_cache.m_parent_xpubs._M_h._M_bucket_count = 1;
    temp_cache.m_parent_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    temp_cache.m_parent_xpubs._M_h._M_element_count = 0;
    temp_cache.m_parent_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    temp_cache.m_parent_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
    temp_cache.m_parent_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    temp_cache.m_last_hardened_xpubs._M_h._M_bucket_count = 1;
    temp_cache.m_last_hardened_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    temp_cache.m_last_hardened_xpubs._M_h._M_element_count = 0;
    temp_cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    temp_cache.m_last_hardened_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
    temp_cache.m_last_hardened_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    peVar5 = (descriptor->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    temp_cache.m_last_hardened_xpubs._M_h._M_buckets =
         &temp_cache.m_last_hardened_xpubs._M_h._M_single_bucket;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar10 = (*peVar5->_vptr_Descriptor[9])(peVar5,(ulong)uVar14,this_00,&scripts_temp,&out_keys);
    if (((char)iVar10 == '\0') &&
       (peVar5 = (descriptor->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,
       iVar10 = (*peVar5->_vptr_Descriptor[8])
                          (peVar5,(ulong)uVar14,&provider,&scripts_temp,&out_keys,&temp_cache),
       (char)iVar10 == '\0')) {
      DescriptorCache::~DescriptorCache(&temp_cache);
      std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts_temp);
      FlatSigningProvider::~FlatSigningProvider(&out_keys);
      goto LAB_00974eb8;
    }
    std::
    _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<CScript*,std::vector<CScript,std::allocator<CScript>>>>
              ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                *)&new_spks,
               (__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>)
               scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>)
               scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_finish);
    pCVar7 = scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_start;
        p_Var13 = out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        __k != pCVar7; __k = __k + 1) {
      puVar11 = (uint *)std::
                        map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
                        ::operator[](&this->m_map_script_pub_keys,__k);
      *puVar11 = uVar14;
    }
    for (; (_Rb_tree_header *)p_Var13 != p_Var2;
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13)) {
      __x = (key_type *)((long)&p_Var13[1]._M_left + 4);
      sVar12 = std::
               map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
               ::count(&this->m_map_pubkeys,__x);
      if (sVar12 == 0) {
        puVar11 = (uint *)std::
                          map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
                          ::operator[](&this->m_map_pubkeys,__x);
        *puVar11 = uVar14;
      }
    }
    DescriptorCache::MergeAndDiff(&new_items,this_00,&temp_cache);
    bVar8 = WalletBatch::WriteDescriptorCacheItems(batch,&id,&new_items);
    if (!bVar8) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"TopUpWithDB",&local_439);
      std::operator+(&local_298,&local_2b8,": writing cache items failed");
      std::runtime_error::runtime_error(this_01,(string *)&local_298);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_009750ae;
    }
    this->m_max_cached_index = this->m_max_cached_index + 1;
    DescriptorCache::~DescriptorCache(&new_items);
    DescriptorCache::~DescriptorCache(&temp_cache);
    std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts_temp);
    FlatSigningProvider::~FlatSigningProvider(&out_keys);
  } while( true );
}

Assistant:

bool DescriptorScriptPubKeyMan::TopUpWithDB(WalletBatch& batch, unsigned int size)
{
    LOCK(cs_desc_man);
    std::set<CScript> new_spks;
    unsigned int target_size;
    if (size > 0) {
        target_size = size;
    } else {
        target_size = m_keypool_size;
    }

    // Calculate the new range_end
    int32_t new_range_end = std::max(m_wallet_descriptor.next_index + (int32_t)target_size, m_wallet_descriptor.range_end);

    // If the descriptor is not ranged, we actually just want to fill the first cache item
    if (!m_wallet_descriptor.descriptor->IsRange()) {
        new_range_end = 1;
        m_wallet_descriptor.range_end = 1;
        m_wallet_descriptor.range_start = 0;
    }

    FlatSigningProvider provider;
    provider.keys = GetKeys();

    uint256 id = GetID();
    for (int32_t i = m_max_cached_index + 1; i < new_range_end; ++i) {
        FlatSigningProvider out_keys;
        std::vector<CScript> scripts_temp;
        DescriptorCache temp_cache;
        // Maybe we have a cached xpub and we can expand from the cache first
        if (!m_wallet_descriptor.descriptor->ExpandFromCache(i, m_wallet_descriptor.cache, scripts_temp, out_keys)) {
            if (!m_wallet_descriptor.descriptor->Expand(i, provider, scripts_temp, out_keys, &temp_cache)) return false;
        }
        // Add all of the scriptPubKeys to the scriptPubKey set
        new_spks.insert(scripts_temp.begin(), scripts_temp.end());
        for (const CScript& script : scripts_temp) {
            m_map_script_pub_keys[script] = i;
        }
        for (const auto& pk_pair : out_keys.pubkeys) {
            const CPubKey& pubkey = pk_pair.second;
            if (m_map_pubkeys.count(pubkey) != 0) {
                // We don't need to give an error here.
                // It doesn't matter which of many valid indexes the pubkey has, we just need an index where we can derive it and it's private key
                continue;
            }
            m_map_pubkeys[pubkey] = i;
        }
        // Merge and write the cache
        DescriptorCache new_items = m_wallet_descriptor.cache.MergeAndDiff(temp_cache);
        if (!batch.WriteDescriptorCacheItems(id, new_items)) {
            throw std::runtime_error(std::string(__func__) + ": writing cache items failed");
        }
        m_max_cached_index++;
    }
    m_wallet_descriptor.range_end = new_range_end;
    batch.WriteDescriptor(GetID(), m_wallet_descriptor);

    // By this point, the cache size should be the size of the entire range
    assert(m_wallet_descriptor.range_end - 1 == m_max_cached_index);

    m_storage.TopUpCallback(new_spks, this);
    NotifyCanGetAddressesChanged();
    return true;
}